

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_no_value.hpp
# Opt level: O0

string_t * __thiscall
cfgfile::tag_no_value_t<cfgfile::qstring_trait_t>::print
          (tag_no_value_t<cfgfile::qstring_trait_t> *this,int indent)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference pptVar3;
  int in_EDX;
  tag_t<cfgfile::qstring_trait_t> *in_RSI;
  string_t *in_RDI;
  tag_t<cfgfile::qstring_trait_t> *tag;
  const_iterator __end0;
  const_iterator __begin0;
  child_tags_list_t *__range4;
  string_t *result;
  qstring_wrapper_t *in_stack_ffffffffffffff38;
  qstring_wrapper_t *in_stack_ffffffffffffff40;
  QChar ch;
  undefined1 local_80 [24];
  tag_t<cfgfile::qstring_trait_t> *local_68;
  tag_t<cfgfile::qstring_trait_t> **local_60;
  __normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
  local_58;
  qstring_wrapper_t *local_50;
  undefined2 local_46;
  undefined2 local_44;
  undefined2 local_42;
  undefined1 local_15;
  int local_14;
  qstring_wrapper_t *this_00;
  
  local_15 = 0;
  local_14 = in_EDX;
  qstring_wrapper_t::qstring_wrapper_t((qstring_wrapper_t *)0x109d15);
  bVar1 = tag_t<cfgfile::qstring_trait_t>::is_defined(in_RSI);
  if (bVar1) {
    local_42 = const_t<cfgfile::qstring_trait_t>::c_tab;
    qstring_wrapper_t::qstring_wrapper_t
              (in_stack_ffffffffffffff38,0,
               (QChar)(char16_t)((ulong)in_stack_ffffffffffffff40 >> 0x30));
    qstring_wrapper_t::append(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    qstring_wrapper_t::~qstring_wrapper_t((qstring_wrapper_t *)0x109d83);
    local_44 = const_t<cfgfile::qstring_trait_t>::c_begin_tag;
    qstring_wrapper_t::push_back
              (in_stack_ffffffffffffff38,(QChar)(char16_t)((ulong)in_stack_ffffffffffffff40 >> 0x30)
              );
    tag_t<cfgfile::qstring_trait_t>::name(in_RSI);
    qstring_wrapper_t::append(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    iVar2 = (*in_RSI->_vptr_tag_t[2])();
    this_00 = (qstring_wrapper_t *)CONCAT44(extraout_var,iVar2);
    bVar1 = std::
            vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
            ::empty((vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
                     *)in_RDI);
    if (!bVar1) {
      local_46 = const_t<cfgfile::qstring_trait_t>::c_carriage_return;
      qstring_wrapper_t::push_back
                (in_stack_ffffffffffffff38,(QChar)(char16_t)((ulong)this_00 >> 0x30));
      iVar2 = (*in_RSI->_vptr_tag_t[2])();
      in_stack_ffffffffffffff38 = (qstring_wrapper_t *)CONCAT44(extraout_var_00,iVar2);
      local_50 = in_stack_ffffffffffffff38;
      local_58._M_current =
           (tag_t<cfgfile::qstring_trait_t> **)
           std::
           vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
           ::begin((vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
                    *)in_stack_ffffffffffffff38);
      local_60 = (tag_t<cfgfile::qstring_trait_t> **)
                 std::
                 vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
                 ::end((vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
                        *)in_stack_ffffffffffffff38);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
                                 *)this_00,
                                (__normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
                                 *)in_stack_ffffffffffffff38), bVar1) {
        pptVar3 = __gnu_cxx::
                  __normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
                  ::operator*(&local_58);
        local_68 = *pptVar3;
        (*local_68->_vptr_tag_t[3])(local_80,local_68,(ulong)(local_14 + 1));
        qstring_wrapper_t::append(this_00,in_stack_ffffffffffffff38);
        qstring_wrapper_t::~qstring_wrapper_t((qstring_wrapper_t *)0x109ead);
        __gnu_cxx::
        __normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
        ::operator++(&local_58);
      }
      qstring_wrapper_t::qstring_wrapper_t
                (in_stack_ffffffffffffff38,0,(QChar)(char16_t)((ulong)this_00 >> 0x30));
      qstring_wrapper_t::append(this_00,in_stack_ffffffffffffff38);
      qstring_wrapper_t::~qstring_wrapper_t((qstring_wrapper_t *)0x109f5d);
    }
    ch.ucs = (char16_t)((ulong)this_00 >> 0x30);
    qstring_wrapper_t::push_back(in_stack_ffffffffffffff38,ch);
    qstring_wrapper_t::push_back(in_stack_ffffffffffffff38,ch);
  }
  return in_RDI;
}

Assistant:

typename Trait::string_t print( int indent = 0 ) const override
	{
		typename Trait::string_t result;

		if( this->is_defined() )
		{
			result.append( typename Trait::string_t( indent,
				const_t< Trait >::c_tab ) );

			result.push_back( const_t< Trait >::c_begin_tag );
			result.append( this->name() );

			if( !this->children().empty() )
			{
				result.push_back( const_t< Trait >::c_carriage_return );

				for( const tag_t< Trait > * tag : this->children() )
					result.append( tag->print( indent + 1 ) );

				result.append( typename Trait::string_t( indent,
					const_t< Trait >::c_tab ) );
			}

			result.push_back( const_t< Trait >::c_end_tag );
			result.push_back( const_t< Trait >::c_carriage_return );
		}

		return result;
	}